

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O0

void __thiscall
mxx::sync_basic_ostream<char,_std::char_traits<char>_>::sync_flush
          (sync_basic_ostream<char,_std::char_traits<char>_> *this)

{
  undefined4 uVar1;
  int iVar2;
  char *data;
  size_t size;
  reference pvVar3;
  pointer pbVar4;
  allocator local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_b8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_b0;
  string local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> recv_string;
  iterator iStack_80;
  int i;
  iterator begin;
  vector<char,_std::allocator<char>_> strings;
  unsigned_long local_50;
  undefined1 local_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  sync_basic_ostream<char,_std::char_traits<char>_> *this_local;
  
  std::
  unique_ptr<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator->((unique_ptr<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x20);
  std::__cxx11::stringbuf::str();
  local_50 = std::__cxx11::string::size();
  gather<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,&local_50,
             *(int *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18,
             *(comm **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8);
  data = (char *)std::__cxx11::string::operator[]
                           ((ulong)&recv_counts.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  size = std::__cxx11::string::size();
  gatherv<char>((vector<char,_std::allocator<char>_> *)&begin,data,size,
                (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
                *(int *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18,
                *(comm **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x8);
  iVar2 = mxx::comm::rank(*(comm **)&(this->super_basic_ostream<char,_std::char_traits<char>_>).
                                     field_0x8);
  if (iVar2 == *(int *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18) {
    iStack_80 = std::vector<char,_std::allocator<char>_>::begin
                          ((vector<char,_std::allocator<char>_> *)&begin);
    for (recv_string.field_2._12_4_ = 0; uVar1 = recv_string.field_2._12_4_,
        iVar2 = mxx::comm::size(*(comm **)&(this->super_basic_ostream<char,_std::char_traits<char>_>
                                           ).field_0x8), (int)uVar1 < iVar2;
        recv_string.field_2._12_4_ = recv_string.field_2._12_4_ + 1) {
      local_b0._M_current = iStack_80._M_current;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
                          (long)(int)recv_string.field_2._12_4_);
      local_b8 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator+(&stack0xffffffffffffff80,*pvVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                (local_a8,local_b0,local_b8,&local_b9);
      std::allocator<char>::~allocator(&local_b9);
      std::operator<<(*(ostream **)
                       &(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x10,
                      local_a8);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
                          (long)(int)recv_string.field_2._12_4_);
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator+=
                (&stack0xffffffffffffff80,*pvVar3);
      std::__cxx11::string::~string(local_a8);
    }
  }
  pbVar4 = std::
           unique_ptr<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->((unique_ptr<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&(this->super_basic_ostream<char,_std::char_traits<char>_>).field_0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"",&local_e1);
  std::__cxx11::stringbuf::str((string *)pbVar4);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&begin);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  std::__cxx11::string::~string
            ((string *)
             &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void sync_flush() {
        // communicate all data to rank `root`
        std::basic_string<CharT, Traits> str = m_buf->str();
        std::vector<size_t> recv_counts = mxx::gather(str.size(), m_root, m_comm);
        std::vector<CharT> strings = mxx::gatherv(&str[0], str.size(), recv_counts, m_root, m_comm);
        // on `root`: output all strings
        if (m_comm.rank() == m_root) {
            typename std::vector<CharT>::iterator begin = strings.begin();
            for (int i = 0; i < m_comm.size(); ++i) {
                std::basic_string<CharT, Traits> recv_string(begin, begin + recv_counts[i]);
                *m_stream << recv_string;
                begin += recv_counts[i];
            }
        }
        // clear buffer content
        m_buf->str("");
    }